

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_StringOptionEquals_Test::~ClCommandLine_StringOptionEquals_Test
          (ClCommandLine_StringOptionEquals_Test *this)

{
  ClCommandLine_StringOptionEquals_Test *this_local;
  
  ~ClCommandLine_StringOptionEquals_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, StringOptionEquals) {
    opt<std::string> option ("arg");
    this->add ("progname", "--arg=value");

    string_stream output;
    string_stream errors;
    EXPECT_TRUE (this->parse_command_line_options (output, errors));

    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (option.get (), "value");
    EXPECT_EQ (option.get_num_occurrences (), 1U);
}